

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

bool kratos::MultipleDriverVisitor::has_for_loop(Stmt *stmt)

{
  bool bVar1;
  StatementType SVar2;
  int iVar3;
  IRNodeKind IVar4;
  undefined4 extraout_var;
  IRNode *p;
  Stmt *stmt_local;
  Stmt *stmt_00;
  
  SVar2 = Stmt::type(stmt);
  if (SVar2 == For) {
    stmt_local._7_1_ = true;
  }
  else {
    iVar3 = (*(stmt->super_IRNode)._vptr_IRNode[4])();
    stmt_00 = (Stmt *)CONCAT44(extraout_var,iVar3);
    if ((stmt_00 != (Stmt *)0x0) &&
       (IVar4 = IRNode::ir_node_kind((IRNode *)stmt_00), IVar4 == StmtKind)) {
      bVar1 = has_for_loop(stmt_00);
      return bVar1;
    }
    stmt_local._7_1_ = false;
  }
  return stmt_local._7_1_;
}

Assistant:

static bool has_for_loop(Stmt* stmt) {
        if (stmt->type() == StatementType::For) {
            return true;
        } else {
            auto* p = stmt->parent();
            if (p && p->ir_node_kind() == IRNodeKind::StmtKind) {
                return has_for_loop(reinterpret_cast<Stmt*>(p));
            }
        }
        return false;
    }